

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

CURLcode Curl_mime_duppart(curl_mimepart *dst,curl_mimepart *src)

{
  curl_mime *subparts;
  curl_mimepart *dst_00;
  curl_slist *headers;
  CURLcode local_54;
  CURLcode local_4c;
  curl_slist *hdrs;
  curl_mimepart *pcStack_30;
  CURLcode res;
  curl_mimepart *s;
  curl_mimepart *d;
  curl_mime *mime;
  curl_mimepart *src_local;
  curl_mimepart *dst_local;
  
  hdrs._4_4_ = CURLE_OK;
  switch(src->kind) {
  case MIMEKIND_NONE:
    break;
  case MIMEKIND_DATA:
    hdrs._4_4_ = curl_mime_data(dst,src->data,src->datasize);
    break;
  case MIMEKIND_FILE:
    hdrs._4_4_ = curl_mime_filedata(dst,src->data);
    if (hdrs._4_4_ == CURLE_READ_ERROR) {
      hdrs._4_4_ = CURLE_OK;
    }
    break;
  case MIMEKIND_CALLBACK:
    hdrs._4_4_ = curl_mime_data_cb(dst,src->datasize,src->readfunc,src->seekfunc,src->freefunc,
                                   src->arg);
    break;
  case MIMEKIND_MULTIPART:
    subparts = curl_mime_init(dst->easy);
    if (subparts == (curl_mime *)0x0) {
      local_4c = CURLE_OUT_OF_MEMORY;
    }
    else {
      local_4c = curl_mime_subparts(dst,subparts);
    }
    hdrs._4_4_ = local_4c;
    pcStack_30 = *(curl_mimepart **)((long)src->arg + 0x10);
    while (hdrs._4_4_ == CURLE_OK && pcStack_30 != (curl_mimepart *)0x0) {
      dst_00 = curl_mime_addpart(subparts);
      if (dst_00 == (curl_mimepart *)0x0) {
        local_54 = CURLE_OUT_OF_MEMORY;
      }
      else {
        local_54 = Curl_mime_duppart(dst_00,pcStack_30);
      }
      pcStack_30 = pcStack_30->nextpart;
      hdrs._4_4_ = local_54;
    }
    break;
  default:
    hdrs._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  if ((hdrs._4_4_ == CURLE_OK) && (src->userheaders != (curl_slist *)0x0)) {
    headers = Curl_slist_duplicate(src->userheaders);
    if (headers == (curl_slist *)0x0) {
      hdrs._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      hdrs._4_4_ = curl_mime_headers(dst,headers,1);
      if (hdrs._4_4_ != CURLE_OK) {
        curl_slist_free_all(headers);
      }
    }
  }
  if (dst == (curl_mimepart *)0x0) {
    hdrs._4_4_ = CURLE_WRITE_ERROR;
  }
  else {
    dst->encoder = src->encoder;
  }
  if (hdrs._4_4_ == CURLE_OK) {
    hdrs._4_4_ = curl_mime_type(dst,src->mimetype);
  }
  if (hdrs._4_4_ == CURLE_OK) {
    hdrs._4_4_ = curl_mime_name(dst,src->name);
  }
  if (hdrs._4_4_ == CURLE_OK) {
    hdrs._4_4_ = curl_mime_filename(dst,src->filename);
  }
  if ((hdrs._4_4_ != CURLE_OK) && (dst != (curl_mimepart *)0x0)) {
    Curl_mime_cleanpart(dst);
  }
  return hdrs._4_4_;
}

Assistant:

CURLcode Curl_mime_duppart(curl_mimepart *dst, const curl_mimepart *src)
{
  curl_mime *mime;
  curl_mimepart *d;
  const curl_mimepart *s;
  CURLcode res = CURLE_OK;

  /* Duplicate content. */
  switch(src->kind) {
  case MIMEKIND_NONE:
    break;
  case MIMEKIND_DATA:
    res = curl_mime_data(dst, src->data, (size_t) src->datasize);
    break;
  case MIMEKIND_FILE:
    res = curl_mime_filedata(dst, src->data);
    /* Do not abort duplication if file is not readable. */
    if(res == CURLE_READ_ERROR)
      res = CURLE_OK;
    break;
  case MIMEKIND_CALLBACK:
    res = curl_mime_data_cb(dst, src->datasize, src->readfunc,
                            src->seekfunc, src->freefunc, src->arg);
    break;
  case MIMEKIND_MULTIPART:
    /* No one knows about the cloned subparts, thus always attach ownership
       to the part. */
    mime = curl_mime_init(dst->easy);
    res = mime? curl_mime_subparts(dst, mime): CURLE_OUT_OF_MEMORY;

    /* Duplicate subparts. */
    for(s = ((curl_mime *) src->arg)->firstpart; !res && s; s = s->nextpart) {
      d = curl_mime_addpart(mime);
      res = d? Curl_mime_duppart(d, s): CURLE_OUT_OF_MEMORY;
    }
    break;
  default:  /* Invalid kind: should not occur. */
    res = CURLE_BAD_FUNCTION_ARGUMENT;  /* Internal error? */
    break;
  }

  /* Duplicate headers. */
  if(!res && src->userheaders) {
    struct curl_slist *hdrs = Curl_slist_duplicate(src->userheaders);

    if(!hdrs)
      res = CURLE_OUT_OF_MEMORY;
    else {
      /* No one but this procedure knows about the new header list,
         so always take ownership. */
      res = curl_mime_headers(dst, hdrs, TRUE);
      if(res)
        curl_slist_free_all(hdrs);
    }
  }

  /* Duplicate other fields. */
  if(dst != NULL)
    dst->encoder = src->encoder;
  else
    res = CURLE_WRITE_ERROR;
  if(!res)
    res = curl_mime_type(dst, src->mimetype);
  if(!res)
    res = curl_mime_name(dst, src->name);
  if(!res)
    res = curl_mime_filename(dst, src->filename);

  /* If an error occurred, rollback. */
  if(res && dst)
    Curl_mime_cleanpart(dst);

  return res;
}